

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O2

void __thiscall Refal2::CVariablesBuilder::Reset(CVariablesBuilder *this)

{
  int i;
  CQualifier *this_00;
  long lVar1;
  
  this_00 = &this->variables[0].Qualifier;
  for (lVar1 = 0; lVar1 < this->firstFreeVariableIndex; lVar1 = lVar1 + 1) {
    CQualifier::Empty(this_00);
    this_00 = (CQualifier *)(this_00[1].ansichars.super__Base_bitset<2UL>._M_w + 1);
  }
  this->firstFreeVariableIndex = 0;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    *(undefined4 *)(&(this->super_CErrorsHelper).field_0xa4 + lVar1 * 4) = 0xffffffff;
  }
  return;
}

Assistant:

void CVariablesBuilder::Reset()
{
	for( int i = 0; i < firstFreeVariableIndex; i++ ) {
		variables[i].Qualifier.Empty();
	}
	firstFreeVariableIndex = 0;
	for( int i = 0; i < VariableNameToIndexSize; i++ ) {
		variableNameToIndex[i] = InvalidVariableIndex;
	}
}